

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CESkyCoord * __thiscall CESkyCoord::operator=(CESkyCoord *this,CESkyCoord *other)

{
  CESkyCoord *in_RSI;
  CESkyCoord *in_RDI;
  CESkyCoord *unaff_retaddr;
  
  if (in_RDI != in_RSI) {
    free_members(in_RDI);
    init_members(unaff_retaddr);
    copy_members(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

CESkyCoord& CESkyCoord::operator=(const CESkyCoord& other)
{
    if (this != &other) {
        free_members();
        init_members();
        copy_members(other);
    }
    return *this;
}